

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void streamable(void)

{
  stringstream ss;
  Assert local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(local_180,"streamable");
  local_1c0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1c0.m_line = 0xb7;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[11],std::__cxx11::string>
            (&local_1c0,(char (*) [11])0x111504,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

TEST(streamable)
{
    auto s  = test::streamable_class{};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("streamable", ss.str());
}